

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-network.cc
# Opt level: O3

bool tinyusdz::tydra::GetDirectlyBoundMaterial
               (Stage *_stage,Prim *prim,string *purpose,Path *materialPath,Material **material,
               string *err)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  ostringstream ss_e;
  string *local_1f8;
  _Any_data local_1f0;
  long *local_1e0;
  long local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  local_1f8 = err;
  local_1f0._M_unused._M_object = material;
  local_1f0._8_8_ = materialPath;
  if (materialPath == (Path *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc"
               ,0x5e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"GetDirectlyBoundMaterial",0x18);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<(local_1a0,0xb4);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    pcVar4 = "`materialPath` ptr is null.";
    lVar3 = 0x1b;
  }
  else {
    if (material != (Material **)0x0) {
      local_1c0._8_8_ = 0;
      local_1c0._0_8_ = operator_new(0x20);
      *(string **)local_1c0._0_8_ = purpose;
      *(char **)(local_1c0._0_8_ + 8) = local_1f0._M_pod_data + 8;
      *(string ***)(local_1c0._0_8_ + 0x10) = &local_1f8;
      *(_Any_data **)(local_1c0._0_8_ + 0x18) = &local_1f0;
      local_1b0._8_8_ =
           ::std::
           _Function_handler<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc:187:20)>
           ::_M_invoke;
      local_1b0._0_8_ =
           ::std::
           _Function_handler<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc:187:20)>
           ::_M_manager;
      bVar1 = ApplyToMaterialBinding
                        ((tydra *)_stage,(Stage *)prim,(Prim *)local_1c0,
                         (function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*)>
                          *)&local_1f0);
      if ((code *)local_1b0._0_8_ == (code *)0x0) {
        return bVar1;
      }
      (*(code *)local_1b0._0_8_)(local_1c0,local_1c0,3);
      return bVar1;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc"
               ,0x5e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"GetDirectlyBoundMaterial",0x18);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<(local_1a0,0xb8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    pcVar4 = "`material` ptr is null.";
    lVar3 = 0x17;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar4,lVar3);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1e0);
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  ::std::ios_base::~ios_base(local_130);
  return false;
}

Assistant:

bool GetDirectlyBoundMaterial(
  const Stage &_stage,
  const Prim &prim,
  const std::string &purpose,
  tinyusdz::Path *materialPath,
  const Material **material,
  std::string *err) {

  if (!materialPath) {
    PUSH_ERROR_AND_RETURN("`materialPath` ptr is null.");
  }

  if (!material) {
    PUSH_ERROR_AND_RETURN("`material` ptr is null.");
  }

  auto apply_fun = [&](const Stage &stage, const MaterialBinding *mb) -> bool {

    Relationship mat_rel;
    if (!mb->get_materialBinding(value::token(purpose), &mat_rel)) {
      return false;
    }

    if (!GetSinglePath(mat_rel, materialPath)) {
      std::string binding_name = kMaterialBinding;
      if (!purpose.empty()) {
        binding_name += ":" + purpose;
      }
      PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be single targetPath", binding_name));
    }

    const Prim *p{nullptr};
    if (stage.find_prim_at_path(*materialPath, p, err)) {
      if (p->is<Material>()) {
        (*material) = p->as<Material>();
        return true;
      } else {
        (*material) = nullptr;
      }
    }

    return false;
  };

  bool ret = ApplyToMaterialBinding(_stage, prim, apply_fun);

  return ret;
}